

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O2

void parseHEXFile(filebuf *file)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  _If_sv<std::basic_string_view<char>,_size_type> _Var4;
  ushort uVar5;
  ushort uVar6;
  string line;
  ushort local_74;
  string local_70;
  vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_> *local_50;
  filebuf *local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_74 = (ushort)options.nbPalettes * (ushort)options.nbColorsPerPal;
  uVar6 = 0;
  local_50 = &options.palSpec;
  local_48 = file;
  while( true ) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    readLine(local_48,&local_70);
    if (local_70._M_string_length == 0) {
      std::__cxx11::string::~string((string *)&local_70);
      if (local_74 < uVar6) {
        warning("HEX file contains %u colors, but there can only be %u; ignoring extra",(ulong)uVar6
               );
      }
      return;
    }
    if (local_70._M_string_length != 6) break;
    local_40._M_len = 0x16;
    local_40._M_str = "0123456789ABCDEFabcdef";
    _Var4 = std::__cxx11::string::
            find_first_not_of<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)&local_70,&local_40,0);
    if (_Var4 != 0xffffffffffffffff) break;
    bVar1 = toHex(*local_70._M_dataplus._M_p,local_70._M_dataplus._M_p[1]);
    bVar2 = toHex(local_70._M_dataplus._M_p[2],local_70._M_dataplus._M_p[3]);
    bVar3 = toHex(local_70._M_dataplus._M_p[4],local_70._M_dataplus._M_p[5]);
    uVar6 = uVar6 + 1;
    if (uVar6 < local_74) {
      uVar5 = uVar6 % (ushort)options.nbColorsPerPal;
      if (uVar5 == 1) {
        std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::emplace_back<>
                  (local_50);
        uVar5 = uVar6 % (ushort)options.nbColorsPerPal;
      }
      options.palSpec.
      super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish[-1]._M_elems[uVar5] =
           (Rgba)((uint)bVar1 | (uint)bVar2 << 8 | (uint)bVar3 << 0x10 | 0xff000000);
    }
    std::__cxx11::string::~string((string *)&local_70);
  }
  error("Failed to parse color #%u (\"%s\"): invalid \"rrggbb\" line",(ulong)(uVar6 + 1),
        local_70._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

static void parseHEXFile(std::filebuf &file) {
	// https://lospec.com/palette-list/tag/gbc

	uint16_t nbColors = 0;
	uint16_t maxNbColors = options.nbColorsPerPal * options.nbPalettes;

	for (;;) {
		std::string line;
		readLine(file, line);
		if (!line.length()) {
			break;
		}

		if (line.length() != 6
		    || line.find_first_not_of("0123456789ABCDEFabcdef"sv) != std::string::npos) {
			error("Failed to parse color #%" PRIu16 " (\"%s\"): invalid \"rrggbb\" line",
			      nbColors + 1, line.c_str());
			return;
		}

		Rgba color =
		    Rgba(toHex(line[0], line[1]), toHex(line[2], line[3]), toHex(line[4], line[5]), 0xFF);

		++nbColors;
		if (nbColors < maxNbColors) {
			if (nbColors % options.nbColorsPerPal == 1) {
				options.palSpec.emplace_back();
			}
			options.palSpec.back()[nbColors % options.nbColorsPerPal] = color;
		}
	}

	if (nbColors > maxNbColors) {
		warning("HEX file contains %" PRIu16 " colors, but there can only be %" PRIu16
		        "; ignoring extra",
		        nbColors, maxNbColors);
	}
}